

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O2

void write_crl(scep *s)

{
  int iVar1;
  X509_CRL *x;
  FILE *fp;
  char *__format;
  
  x = (X509_CRL *)OPENSSL_sk_value(((s->reply_p7->d).sign)->crl,0);
  if (x == (X509_CRL *)0x0) {
    __format = "%s: cannot find CRL in reply\n";
  }
  else {
    fp = fopen(w_char,"w");
    if (fp != (FILE *)0x0) {
      if (v_flag != 0) {
        printf("%s: writing CRL\n",pname);
      }
      if (d_flag != 0) {
        PEM_write_X509_CRL(_stdout,x);
      }
      iVar1 = PEM_write_X509_CRL(fp,x);
      if (iVar1 == 1) {
        printf("%s: CRL written as %s\n",pname,w_char);
        fclose(fp);
        return;
      }
      fprintf(_stderr,"%s: error while writing CRL file\n",pname);
      ERR_print_errors_fp(_stderr);
      goto LAB_0010c8aa;
    }
    __format = "%s: cannot open CRL file for writing\n";
  }
  fprintf(_stderr,__format,pname);
LAB_0010c8aa:
  exit(0x5d);
}

Assistant:

void
write_crl(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509_CRL)	*crls;
	X509_CRL		*crl;	
	FILE			*fp;

	/* Get CRL */
	p7 = s->reply_p7;
	crls = p7->d.sign->crl;
	
	/* We expect only one CRL: */
	crl = sk_X509_CRL_value(crls, 0);
	if (crl == NULL) {
		fprintf(stderr, "%s: cannot find CRL in reply\n", pname);
		exit (SCEP_PKISTATUS_FILE);
	}

	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open CRL file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: writing CRL\n", pname);
	if (d_flag)
		PEM_write_X509_CRL(stdout, crl);
	if (PEM_write_X509_CRL(fp, crl) != 1) {
		fprintf(stderr, "%s: error while writing CRL "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	printf("%s: CRL written as %s\n", pname, w_char);
	(void)fclose(fp);
}